

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  size_t sVar4;
  int local_54;
  int local_50;
  int x;
  int i;
  int local_3c;
  undefined1 local_38 [4];
  int n;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> m;
  
  m.mMaxLoadFactor = 0.0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::unordered_map
            ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *)local_38);
  std::istream::operator>>((istream *)&std::cin,&local_3c);
  for (local_50 = 0; local_50 < local_3c; local_50 = local_50 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_54);
    iVar1 = local_54;
    piVar2 = CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::operator[]
                       ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *)local_38,
                        &local_54);
    *piVar2 = iVar1;
    poVar3 = std::operator<<((ostream *)&std::cout,"max bucket length = ");
    sVar4 = CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::max_bucket_length
                      ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *)local_38);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::~unordered_map
            ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *)local_38);
  return (int)m.mMaxLoadFactor;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::unordered_map<int,int> m;
  int n;
  std::cin >> n;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    m[x] = x;
    std::cout << "max bucket length = " << m.max_bucket_length() << std::endl;
  }
}